

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ES5ArrayTypeHandler.cpp
# Opt level: O2

BOOL __thiscall
Js::ES5ArrayTypeHandlerBase<unsigned_short>::DeleteItem
          (ES5ArrayTypeHandlerBase<unsigned_short> *this,ES5Array *arr,DynamicObject *instance,
          uint32 index,PropertyOperationFlags propertyOperationFlags)

{
  ScriptContext *scriptContext;
  bool bVar1;
  BOOL BVar2;
  IndexPropertyDescriptor *in_RAX;
  JavascriptString *this_00;
  char16 *varName;
  IndexPropertyDescriptor *local_38;
  IndexPropertyDescriptor *descriptor;
  
  local_38 = in_RAX;
  bVar1 = IndexPropertyDescriptorMap::TryGetReference((this->indexPropertyMap).ptr,index,&local_38);
  if (bVar1) {
    if ((local_38->Attributes & 8) != 0) {
      return 1;
    }
    if ((local_38->Attributes & 2) != 0) {
      JavascriptArray::DirectDeleteItemAt<void*>(&arr->super_JavascriptArray,index);
      (local_38->Getter).ptr = (void *)0x0;
      (local_38->Setter).ptr = (void *)0x0;
      local_38->Attributes = '\x0e';
      return 1;
    }
  }
  else {
    if ((this->dataItemAttributes & 2) != 0) {
      BVar2 = JavascriptArray::DirectDeleteItemAt<void*>(&arr->super_JavascriptArray,index);
      return BVar2;
    }
    BVar2 = HasDataItem(this,arr,index);
    if (BVar2 == 0) {
      return 1;
    }
  }
  scriptContext =
       (((((instance->super_RecyclableObject).type.ptr)->javascriptLibrary).ptr)->
       super_JavascriptLibraryBase).scriptContext.ptr;
  this_00 = TaggedInt::ToString(index,scriptContext);
  varName = JavascriptString::GetString(this_00);
  JavascriptError::ThrowCantDeleteIfStrictModeOrNonconfigurable
            (propertyOperationFlags,scriptContext,varName);
  return 0;
}

Assistant:

BOOL ES5ArrayTypeHandlerBase<T>::DeleteItem(ES5Array* arr, DynamicObject* instance, uint32 index, PropertyOperationFlags propertyOperationFlags)
    {
        IndexPropertyDescriptor* descriptor;
        if (indexPropertyMap->TryGetReference(index, &descriptor))
        {
            if (descriptor->Attributes & PropertyDeleted)
            {
                return true;
            }
            else if (!(descriptor->Attributes & PropertyConfigurable))
            {
                JavascriptError::ThrowCantDeleteIfStrictModeOrNonconfigurable(
                    propertyOperationFlags, instance->GetScriptContext(), TaggedInt::ToString(index, instance->GetScriptContext())->GetString());

                return false;
            }

            arr->DirectDeleteItemAt<Var>(index);
            descriptor->Getter = nullptr;
            descriptor->Setter = nullptr;
            descriptor->Attributes = PropertyDeleted | PropertyWritable | PropertyConfigurable;
            return true;
        }

        // Not in attribute map
        if (!(GetDataItemAttributes() & PropertyConfigurable))
        {
            if (HasDataItem(arr, index))
            {
                JavascriptError::ThrowCantDeleteIfStrictModeOrNonconfigurable(
                    propertyOperationFlags, instance->GetScriptContext(), TaggedInt::ToString(index, instance->GetScriptContext())->GetString());

                return false;
            }
            return true; // non-existing non-configurable property can be deleted
        }
        return arr->DirectDeleteItemAt<Var>(index);
    }